

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CuTest.c
# Opt level: O2

void CuStringAppend(CuString *str,char *text)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  int iVar3;
  
  __s = "NULL";
  if (text != (char *)0x0) {
    __s = text;
  }
  sVar2 = strlen(__s);
  iVar1 = (int)sVar2;
  iVar3 = str->length + iVar1;
  if (str->size <= str->length + iVar1 + 1) {
    CuStringResize(str,iVar3 + 0x101);
    iVar3 = iVar1 + str->length;
  }
  str->length = iVar3;
  strcat(str->buffer,__s);
  return;
}

Assistant:

void CuStringAppend(CuString* str, const char* text)
{
	int length;

	if (text == NULL) {
		text = "NULL";
	}

	length = strlen(text);
	if (str->length + length + 1 >= str->size)
		CuStringResize(str, str->length + length + 1 + STRING_INC);
	str->length += length;
	strcat(str->buffer, text);
}